

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_huffman_codes.cpp
# Opt level: O0

sym_freq * crnlib::radix_sort_syms(uint num_syms,sym_freq *syms0,sym_freq *syms1)

{
  uint uVar1;
  sym_freq *psVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  sym_freq *t;
  uint dst_offset;
  uint c;
  uint dst_offset1;
  uint dst_offset0_1;
  uint dst_offset0;
  uint c1;
  uint c0;
  sym_freq *q_1;
  sym_freq *p_1;
  uint local_c70;
  uint pass_shift;
  uint i;
  uint cur_ofs;
  uint offsets [256];
  uint *pHist;
  sym_freq *psStack_858;
  uint pass;
  sym_freq *pNew_syms;
  sym_freq *pCur_syms;
  uint freq;
  uint freq1;
  uint freq0;
  sym_freq *q;
  sym_freq *p;
  uint hist [512];
  uint cMaxPasses;
  sym_freq *syms1_local;
  sym_freq *syms0_local;
  uint num_syms_local;
  
  hist[0x1ff] = 2;
  memset(&p,0,0x800);
  for (q = syms0; q != syms0 + (num_syms & 0xfffffffe); q = q + 2) {
    uVar4 = q->m_freq;
    uVar5 = q[1].m_freq;
    uVar6 = (ulong)(uVar4 & 0xff);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
    uVar6 = (ulong)((uVar4 >> 8 & 0xff) + 0x100);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
    uVar6 = (ulong)(uVar5 & 0xff);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
    uVar6 = (ulong)((uVar5 >> 8 & 0xff) + 0x100);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
  }
  if ((num_syms & 1) != 0) {
    uVar4 = q->m_freq;
    uVar6 = (ulong)(uVar4 & 0xff);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
    uVar6 = (ulong)((uVar4 >> 8 & 0xff) + 0x100);
    hist[uVar6 - 2] = hist[uVar6 - 2] + 1;
  }
  psStack_858 = syms1;
  pNew_syms = syms0;
  for (pHist._4_4_ = 0; pHist._4_4_ < 2; pHist._4_4_ = pHist._4_4_ + 1) {
    offsets._1016_8_ = hist + ((ulong)(pHist._4_4_ << 8) - 2);
    pass_shift = 0;
    for (local_c70 = 0; local_c70 < 0x100; local_c70 = local_c70 + 2) {
      (&i)[local_c70] = pass_shift;
      uVar3 = *(int *)(offsets._1016_8_ + (ulong)local_c70 * 4) + pass_shift;
      (&i)[local_c70 + 1] = uVar3;
      pass_shift = *(int *)(offsets._1016_8_ + (ulong)(local_c70 + 1) * 4) + uVar3;
    }
    for (q_1 = pNew_syms; q_1 != pNew_syms + (num_syms & 0xfffffffe); q_1 = q_1 + 2) {
      dst_offset0 = q_1->m_freq;
      dst_offset0_1 = q_1[1].m_freq;
      if (pHist._4_4_ != 0) {
        dst_offset0 = dst_offset0 >> 8;
        dst_offset0_1 = dst_offset0_1 >> 8;
      }
      uVar4 = dst_offset0 & 0xff;
      uVar5 = dst_offset0_1 & 0xff;
      if (uVar4 == uVar5) {
        uVar5 = (&i)[uVar4];
        (&i)[uVar4] = uVar5 + 2;
        psStack_858[uVar5] = *q_1;
        psStack_858[uVar5 + 1] = q_1[1];
      }
      else {
        uVar1 = (&i)[uVar4];
        (&i)[uVar4] = uVar1 + 1;
        uVar4 = (&i)[uVar5];
        (&i)[uVar5] = uVar4 + 1;
        psStack_858[uVar1] = *q_1;
        psStack_858[uVar4] = q_1[1];
      }
    }
    if ((num_syms & 1) != 0) {
      uVar5 = q_1->m_freq >> ((byte)(pHist._4_4_ << 3) & 0x1f) & 0xff;
      uVar4 = (&i)[uVar5];
      (&i)[uVar5] = uVar4 + 1;
      psStack_858[uVar4] = *q_1;
    }
    psVar2 = psStack_858;
    psStack_858 = pNew_syms;
    pNew_syms = psVar2;
  }
  return pNew_syms;
}

Assistant:

static inline sym_freq* radix_sort_syms(uint num_syms, sym_freq* syms0, sym_freq* syms1)
    {
        const uint cMaxPasses = 2;
        uint hist[256 * cMaxPasses];

        memset(hist, 0, sizeof(hist[0]) * 256 * cMaxPasses);

        sym_freq* p = syms0;
        sym_freq* q = syms0 + (num_syms >> 1) * 2;

        for (; p != q; p += 2)
        {
            const uint freq0 = p[0].m_freq;
            const uint freq1 = p[1].m_freq;

            hist[freq0 & 0xFF]++;
            hist[256 + ((freq0 >> 8) & 0xFF)]++;

            hist[freq1 & 0xFF]++;
            hist[256 + ((freq1 >> 8) & 0xFF)]++;
        }

        if (num_syms & 1)
        {
            const uint freq = p->m_freq;

            hist[freq & 0xFF]++;
            hist[256 + ((freq >> 8) & 0xFF)]++;
        }

        sym_freq* pCur_syms = syms0;
        sym_freq* pNew_syms = syms1;

        for (uint pass = 0; pass < cMaxPasses; pass++)
        {
            const uint* pHist = &hist[pass << 8];

            uint offsets[256];

            uint cur_ofs = 0;
            for (uint i = 0; i < 256; i += 2)
            {
                offsets[i] = cur_ofs;
                cur_ofs += pHist[i];

                offsets[i + 1] = cur_ofs;
                cur_ofs += pHist[i + 1];
            }

            const uint pass_shift = pass << 3;

            sym_freq* p = pCur_syms;
            sym_freq* q = pCur_syms + (num_syms >> 1) * 2;

            for (; p != q; p += 2)
            {
                uint c0 = p[0].m_freq;
                uint c1 = p[1].m_freq;

                if (pass)
                {
                    c0 >>= 8;
                    c1 >>= 8;
                }

                c0 &= 0xFF;
                c1 &= 0xFF;

                if (c0 == c1)
                {
                    uint dst_offset0 = offsets[c0];

                    offsets[c0] = dst_offset0 + 2;

                    pNew_syms[dst_offset0] = p[0];
                    pNew_syms[dst_offset0 + 1] = p[1];
                }
                else
                {
                    uint dst_offset0 = offsets[c0]++;
                    uint dst_offset1 = offsets[c1]++;

                    pNew_syms[dst_offset0] = p[0];
                    pNew_syms[dst_offset1] = p[1];
                }
            }

            if (num_syms & 1)
            {
                uint c = ((p->m_freq) >> pass_shift) & 0xFF;

                uint dst_offset = offsets[c];
                offsets[c] = dst_offset + 1;

                pNew_syms[dst_offset] = *p;
            }

            sym_freq* t = pCur_syms;
            pCur_syms = pNew_syms;
            pNew_syms = t;
        }

#ifdef CRNLIB_ASSERTS_ENABLED
        uint prev_freq = 0;
        for (uint i = 0; i < num_syms; i++)
        {
            CRNLIB_ASSERT(!(pCur_syms[i].m_freq < prev_freq));
            prev_freq = pCur_syms[i].m_freq;
        }
#endif

        return pCur_syms;
    }